

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O1

void anon_unknown.dwarf_1f65f7::fillPixels<float>
               (Array2D<unsigned_int> *sampleCount,Array2D<float_*> *ph,int width,int height)

{
  long lVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  float **ppfVar4;
  float *pfVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  float fVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  ulong local_58;
  long lVar14;
  
  lVar6 = (long)width;
  uVar3 = height * lVar6;
  ppfVar4 = (float **)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
  if (ph->_data != (float **)0x0) {
    operator_delete__(ph->_data);
  }
  ph->_sizeX = (long)height;
  ph->_sizeY = lVar6;
  ph->_data = ppfVar4;
  if (0 < height) {
    lVar1 = sampleCount->_sizeY;
    local_58 = 0;
    do {
      if (0 < width) {
        lVar9 = lVar1 * local_58;
        uVar3 = 0;
        do {
          pfVar5 = (float *)operator_new__((ulong)sampleCount->_data[lVar9 + uVar3] << 2);
          auVar2 = _DAT_001bcaf0;
          ph->_data[local_58 * lVar6 + uVar3] = pfVar5;
          uVar7 = (ulong)sampleCount->_data[lVar9 + uVar3];
          if (uVar7 != 0) {
            fVar10 = (float)((uint)((int)local_58 * width + (int)uVar3) % 0x801);
            pfVar5 = ph->_data[local_58 * lVar6 + uVar3];
            lVar14 = uVar7 - 1;
            auVar11._8_4_ = (int)lVar14;
            auVar11._0_8_ = lVar14;
            auVar11._12_4_ = (int)((ulong)lVar14 >> 0x20);
            auVar11 = auVar11 ^ auVar2;
            uVar8 = 0;
            auVar13 = _DAT_001bcae0;
            auVar15 = _DAT_001bdfa0;
            do {
              auVar16 = auVar13 ^ auVar2;
              iVar12 = auVar11._4_4_;
              if ((bool)(~(auVar16._4_4_ == iVar12 && auVar11._0_4_ < auVar16._0_4_ ||
                          iVar12 < auVar16._4_4_) & 1)) {
                *(float *)((long)pfVar5 + uVar8) = fVar10;
              }
              if ((auVar16._12_4_ != auVar11._12_4_ || auVar16._8_4_ <= auVar11._8_4_) &&
                  auVar16._12_4_ <= auVar11._12_4_) {
                *(float *)((long)pfVar5 + uVar8 + 4) = fVar10;
              }
              iVar17 = SUB164(auVar15 ^ auVar2,4);
              if (iVar17 <= iVar12 &&
                  (iVar17 != iVar12 || SUB164(auVar15 ^ auVar2,0) <= auVar11._0_4_)) {
                *(float *)((long)pfVar5 + uVar8 + 8) = fVar10;
                *(float *)((long)pfVar5 + uVar8 + 0xc) = fVar10;
              }
              lVar14 = auVar13._8_8_;
              auVar13._0_8_ = auVar13._0_8_ + 4;
              auVar13._8_8_ = lVar14 + 4;
              lVar14 = auVar15._8_8_;
              auVar15._0_8_ = auVar15._0_8_ + 4;
              auVar15._8_8_ = lVar14 + 4;
              uVar8 = uVar8 + 0x10;
            } while ((uVar7 * 4 + 0xc & 0xfffffffffffffff0) != uVar8);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != (uint)width);
      }
      local_58 = local_58 + 1;
    } while (local_58 != (uint)height);
  }
  return;
}

Assistant:

void
fillPixels (
    Array2D<unsigned int>& sampleCount, Array2D<T*>& ph, int width, int height)
{
    ph.resizeErase (height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            ph[y][x] = new T[sampleCount[y][x]];
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                //
                // We do this because half cannot store number bigger than 2048 exactly.
                //
                ph[y][x][i] = (y * width + x) % 2049;
            }
        }
}